

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_adaptive_eval_grid.h
# Opt level: O2

void embree::sse2::
     feature_adaptive_eval_grid<embree::sse2::PatchEvalGrid,embree::PatchT<embree::Vec3fa,embree::Vec3fa>::Ref>
               (Ref *patch,uint subPatch,float *levels,uint x0,uint x1,uint y0,uint y1,uint swidth,
               uint sheight,float *Px,float *Py,float *Pz,float *U,float *V,float *Nx,float *Ny,
               float *Nz,uint dwidth,uint dheight)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  float *pfVar6;
  uint uVar7;
  float *pfVar8;
  float *pfVar9;
  PatchEvalGrid local_a0;
  
  if (levels == (float *)0x0) {
    uVar7 = 0;
    iVar5 = 0;
    iVar2 = 0;
    uVar4 = 0;
  }
  else {
    uVar4 = 0;
    if (x0 == 0) {
      bVar1 = stitch_col<embree::sse2::PatchEvalGrid,embree::PatchT<embree::Vec3fa,embree::Vec3fa>::Ref>
                        (patch,subPatch,false,y0,y1,sheight - 1,(int)levels[3],Px,Py,Pz,U,V,Nx,Ny,Nz
                         ,0,dwidth,dheight);
      uVar4 = (uint)bVar1;
    }
    iVar2 = 0;
    uVar3 = swidth - 1;
    if (uVar3 == x1) {
      bVar1 = stitch_col<embree::sse2::PatchEvalGrid,embree::PatchT<embree::Vec3fa,embree::Vec3fa>::Ref>
                        (patch,subPatch,true,y0,y1,sheight - 1,(int)levels[1],Px,Py,Pz,U,V,Nx,Ny,Nz,
                         x1 - x0,dwidth,dheight);
      iVar2 = -(uint)bVar1;
    }
    uVar7 = 0;
    if (y0 == 0) {
      bVar1 = stitch_row<embree::sse2::PatchEvalGrid,embree::PatchT<embree::Vec3fa,embree::Vec3fa>::Ref>
                        (patch,subPatch,false,x0,x1,uVar3,(int)*levels,Px,Py,Pz,U,V,Nx,Ny,Nz,0,
                         dwidth,dheight);
      uVar7 = (uint)bVar1;
    }
    iVar5 = 0;
    if (sheight - 1 == y1) {
      bVar1 = stitch_row<embree::sse2::PatchEvalGrid,embree::PatchT<embree::Vec3fa,embree::Vec3fa>::Ref>
                        (patch,subPatch,true,x0,x1,uVar3,(int)levels[2],Px,Py,Pz,U,V,Nx,Ny,Nz,
                         y1 - y0,dwidth,dheight);
      iVar5 = -(uint)bVar1;
    }
  }
  uVar3 = uVar7 * dwidth + uVar4;
  pfVar6 = Nx + uVar3;
  if (Nx == (float *)0x0) {
    pfVar6 = (float *)0x0;
  }
  pfVar8 = Ny + uVar3;
  if (Ny == (float *)0x0) {
    pfVar8 = (float *)0x0;
  }
  pfVar9 = Nz + uVar3;
  if (Nz == (float *)0x0) {
    pfVar9 = (float *)0x0;
  }
  PatchEvalGrid::PatchEvalGrid
            (&local_a0,*(undefined8 *)patch,subPatch,x0 + uVar4,iVar2 + x1,y0 + uVar7,iVar5 + y1,
             swidth,sheight,Px + uVar3,Py + uVar3,Pz + uVar3,U + uVar3,V + uVar3,pfVar6,pfVar8,
             pfVar9,dwidth,dheight);
  return;
}

Assistant:

void feature_adaptive_eval_grid (const Patch& patch, unsigned subPatch, const float levels[4],
                                     const unsigned x0, const unsigned x1, const unsigned y0, const unsigned y1, const unsigned swidth, const unsigned sheight, 
                                     float* Px, float* Py, float* Pz, float* U, float* V, float* Nx, float* Ny, float* Nz, const unsigned dwidth, const unsigned dheight)
    {
      bool sl = false, sr = false, st = false, sb = false;
      if (levels) {
        sl = x0 == 0         && stitch_col<Eval,Patch>(patch,subPatch,0,y0,y1,sheight-1,int(levels[3]), Px,Py,Pz,U,V,Nx,Ny,Nz, 0    ,dwidth,dheight);
        sr = x1 == swidth-1  && stitch_col<Eval,Patch>(patch,subPatch,1,y0,y1,sheight-1,int(levels[1]), Px,Py,Pz,U,V,Nx,Ny,Nz, x1-x0,dwidth,dheight);
        st = y0 == 0         && stitch_row<Eval,Patch>(patch,subPatch,0,x0,x1,swidth-1,int(levels[0]), Px,Py,Pz,U,V,Nx,Ny,Nz, 0    ,dwidth,dheight);
        sb = y1 == sheight-1 && stitch_row<Eval,Patch>(patch,subPatch,1,x0,x1,swidth-1,int(levels[2]), Px,Py,Pz,U,V,Nx,Ny,Nz, y1-y0,dwidth,dheight);
      }
      const unsigned ofs = st*dwidth+sl;
      Eval(patch,subPatch,x0+sl,x1-sr,y0+st,y1-sb, swidth,sheight, Px+ofs,Py+ofs,Pz+ofs,U+ofs,V+ofs,Nx?Nx+ofs:nullptr,Ny?Ny+ofs:nullptr,Nz?Nz+ofs:nullptr, dwidth,dheight);
    }